

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage10_avx2(__m256i *x9,__m256i *x10,int32_t *cospi,__m256i *__rounding,int8_t cos_bit)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 (*in_RCX) [32];
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char in_R8B;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m256i in1_w0_15;
  __m256i in0_w1_15;
  __m256i in1_w1_15;
  __m256i in0_w0_15;
  __m256i in1_w0_14;
  __m256i in0_w1_14;
  __m256i in1_w1_14;
  __m256i in0_w0_14;
  __m256i in1_w0_13;
  __m256i in0_w1_13;
  __m256i in1_w1_13;
  __m256i in0_w0_13;
  __m256i in1_w0_12;
  __m256i in0_w1_12;
  __m256i in1_w1_12;
  __m256i in0_w0_12;
  __m256i in1_w0_11;
  __m256i in0_w1_11;
  __m256i in1_w1_11;
  __m256i in0_w0_11;
  __m256i in1_w0_10;
  __m256i in0_w1_10;
  __m256i in1_w1_10;
  __m256i in0_w0_10;
  __m256i in1_w0_9;
  __m256i in0_w1_9;
  __m256i in1_w1_9;
  __m256i in0_w0_9;
  __m256i in1_w0_8;
  __m256i in0_w1_8;
  __m256i in1_w1_8;
  __m256i in0_w0_8;
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  __m256i cospi_p61;
  __m256i cospi_p03;
  __m256i cospi_p29;
  __m256i cospi_p35;
  __m256i cospi_p45;
  __m256i cospi_p19;
  __m256i cospi_p13;
  __m256i cospi_p51;
  __m256i cospi_p53;
  __m256i cospi_p11;
  __m256i cospi_p21;
  __m256i cospi_p43;
  __m256i cospi_p37;
  __m256i cospi_p27;
  __m256i cospi_p05;
  __m256i cospi_p59;
  __m256i cospi_p57;
  __m256i cospi_p07;
  __m256i cospi_p25;
  __m256i cospi_p39;
  __m256i cospi_p41;
  __m256i cospi_p23;
  __m256i cospi_p09;
  __m256i cospi_p55;
  __m256i cospi_p49;
  __m256i cospi_p15;
  __m256i cospi_p17;
  __m256i cospi_p47;
  __m256i cospi_p33;
  __m256i cospi_p31;
  __m256i cospi_p01;
  __m256i cospi_p63;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar1 = *(uint *)(in_RDX + 0xfc);
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar3 = vpinsrd_avx(auVar3,uVar1,2);
  auVar3 = vpinsrd_avx(auVar3,uVar1,3);
  uStack_830 = auVar3._0_8_;
  uStack_828 = auVar3._8_8_;
  uVar1 = *(uint *)(in_RDX + 4);
  auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar3 = vpinsrd_avx(auVar3,uVar1,2);
  auVar3 = vpinsrd_avx(auVar3,uVar1,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar4 = vpinsrd_avx(auVar4,uVar1,2);
  auVar4 = vpinsrd_avx(auVar4,uVar1,3);
  uStack_7f0 = auVar4._0_8_;
  uStack_7e8 = auVar4._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x7c);
  auVar4 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar4 = vpinsrd_avx(auVar4,uVar1,2);
  auVar4 = vpinsrd_avx(auVar4,uVar1,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar5 = vpinsrd_avx(auVar5,uVar1,2);
  auVar5 = vpinsrd_avx(auVar5,uVar1,3);
  uStack_7b0 = auVar5._0_8_;
  uStack_7a8 = auVar5._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x84);
  auVar5 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar5 = vpinsrd_avx(auVar5,uVar1,2);
  auVar5 = vpinsrd_avx(auVar5,uVar1,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar6 = vpinsrd_avx(auVar6,uVar1,2);
  auVar6 = vpinsrd_avx(auVar6,uVar1,3);
  uStack_770 = auVar6._0_8_;
  uStack_768 = auVar6._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xbc);
  auVar6 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar6 = vpinsrd_avx(auVar6,uVar1,2);
  auVar6 = vpinsrd_avx(auVar6,uVar1,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar7 = vpinsrd_avx(auVar7,uVar1,2);
  auVar7 = vpinsrd_avx(auVar7,uVar1,3);
  uStack_730 = auVar7._0_8_;
  uStack_728 = auVar7._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x44);
  auVar7 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar7 = vpinsrd_avx(auVar7,uVar1,2);
  auVar7 = vpinsrd_avx(auVar7,uVar1,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar8 = vpinsrd_avx(auVar8,uVar1,2);
  auVar8 = vpinsrd_avx(auVar8,uVar1,3);
  uStack_6f0 = auVar8._0_8_;
  uStack_6e8 = auVar8._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x3c);
  auVar8 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar8 = vpinsrd_avx(auVar8,uVar1,2);
  auVar8 = vpinsrd_avx(auVar8,uVar1,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar9 = vpinsrd_avx(auVar9,uVar1,2);
  auVar9 = vpinsrd_avx(auVar9,uVar1,3);
  uStack_6b0 = auVar9._0_8_;
  uStack_6a8 = auVar9._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xc4);
  auVar9 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar9 = vpinsrd_avx(auVar9,uVar1,2);
  auVar9 = vpinsrd_avx(auVar9,uVar1,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar10 = vpinsrd_avx(auVar10,uVar1,2);
  auVar10 = vpinsrd_avx(auVar10,uVar1,3);
  uStack_670 = auVar10._0_8_;
  uStack_668 = auVar10._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xdc);
  auVar10 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar10 = vpinsrd_avx(auVar10,uVar1,2);
  auVar10 = vpinsrd_avx(auVar10,uVar1,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar11 = vpinsrd_avx(auVar11,uVar1,2);
  auVar11 = vpinsrd_avx(auVar11,uVar1,3);
  uStack_630 = auVar11._0_8_;
  uStack_628 = auVar11._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x24);
  auVar11 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar11 = vpinsrd_avx(auVar11,uVar1,2);
  auVar11 = vpinsrd_avx(auVar11,uVar1,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar12 = vpinsrd_avx(auVar12,uVar1,2);
  auVar12 = vpinsrd_avx(auVar12,uVar1,3);
  uStack_5f0 = auVar12._0_8_;
  uStack_5e8 = auVar12._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x5c);
  auVar12 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar12 = vpinsrd_avx(auVar12,uVar1,2);
  auVar12 = vpinsrd_avx(auVar12,uVar1,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar13 = vpinsrd_avx(auVar13,uVar1,2);
  auVar13 = vpinsrd_avx(auVar13,uVar1,3);
  uStack_5b0 = auVar13._0_8_;
  uStack_5a8 = auVar13._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xa4);
  auVar13 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar13 = vpinsrd_avx(auVar13,uVar1,2);
  auVar13 = vpinsrd_avx(auVar13,uVar1,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar14 = vpinsrd_avx(auVar14,uVar1,2);
  auVar14 = vpinsrd_avx(auVar14,uVar1,3);
  uStack_570 = auVar14._0_8_;
  uStack_568 = auVar14._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x9c);
  auVar14 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar14 = vpinsrd_avx(auVar14,uVar1,2);
  auVar14 = vpinsrd_avx(auVar14,uVar1,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar15 = vpinsrd_avx(auVar15,uVar1,2);
  auVar15 = vpinsrd_avx(auVar15,uVar1,3);
  uStack_530 = auVar15._0_8_;
  uStack_528 = auVar15._8_8_;
  uVar1 = *(uint *)(in_RDX + 100);
  auVar15 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar15 = vpinsrd_avx(auVar15,uVar1,2);
  auVar15 = vpinsrd_avx(auVar15,uVar1,3);
  auVar16 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar16 = vpinsrd_avx(auVar16,uVar1,2);
  auVar16 = vpinsrd_avx(auVar16,uVar1,3);
  uStack_4f0 = auVar16._0_8_;
  uStack_4e8 = auVar16._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x1c);
  auVar16 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar16 = vpinsrd_avx(auVar16,uVar1,2);
  auVar16 = vpinsrd_avx(auVar16,uVar1,3);
  auVar17 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar17 = vpinsrd_avx(auVar17,uVar1,2);
  auVar17 = vpinsrd_avx(auVar17,uVar1,3);
  uStack_4b0 = auVar17._0_8_;
  uStack_4a8 = auVar17._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xe4);
  auVar17 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar17 = vpinsrd_avx(auVar17,uVar1,2);
  auVar17 = vpinsrd_avx(auVar17,uVar1,3);
  auVar18 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar18 = vpinsrd_avx(auVar18,uVar1,2);
  auVar18 = vpinsrd_avx(auVar18,uVar1,3);
  uStack_470 = auVar18._0_8_;
  uStack_468 = auVar18._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xec);
  auVar18 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar18 = vpinsrd_avx(auVar18,uVar1,2);
  auVar18 = vpinsrd_avx(auVar18,uVar1,3);
  auVar19 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar19 = vpinsrd_avx(auVar19,uVar1,2);
  auVar19 = vpinsrd_avx(auVar19,uVar1,3);
  uStack_430 = auVar19._0_8_;
  uStack_428 = auVar19._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x14);
  auVar19 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar19 = vpinsrd_avx(auVar19,uVar1,2);
  auVar19 = vpinsrd_avx(auVar19,uVar1,3);
  auVar20 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar20 = vpinsrd_avx(auVar20,uVar1,2);
  auVar20 = vpinsrd_avx(auVar20,uVar1,3);
  uStack_3f0 = auVar20._0_8_;
  uStack_3e8 = auVar20._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x6c);
  auVar20 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar20 = vpinsrd_avx(auVar20,uVar1,2);
  auVar20 = vpinsrd_avx(auVar20,uVar1,3);
  auVar21 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar21 = vpinsrd_avx(auVar21,uVar1,2);
  auVar21 = vpinsrd_avx(auVar21,uVar1,3);
  uStack_3b0 = auVar21._0_8_;
  uStack_3a8 = auVar21._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x94);
  auVar21 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar21 = vpinsrd_avx(auVar21,uVar1,2);
  auVar21 = vpinsrd_avx(auVar21,uVar1,3);
  auVar22 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar22 = vpinsrd_avx(auVar22,uVar1,2);
  auVar22 = vpinsrd_avx(auVar22,uVar1,3);
  uStack_370 = auVar22._0_8_;
  uStack_368 = auVar22._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xac);
  auVar22 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar22 = vpinsrd_avx(auVar22,uVar1,2);
  auVar22 = vpinsrd_avx(auVar22,uVar1,3);
  auVar23 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar23 = vpinsrd_avx(auVar23,uVar1,2);
  auVar23 = vpinsrd_avx(auVar23,uVar1,3);
  uStack_330 = auVar23._0_8_;
  uStack_328 = auVar23._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x54);
  auVar23 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar23 = vpinsrd_avx(auVar23,uVar1,2);
  auVar23 = vpinsrd_avx(auVar23,uVar1,3);
  auVar24 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar24 = vpinsrd_avx(auVar24,uVar1,2);
  auVar24 = vpinsrd_avx(auVar24,uVar1,3);
  uStack_2f0 = auVar24._0_8_;
  uStack_2e8 = auVar24._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x2c);
  auVar24 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar24 = vpinsrd_avx(auVar24,uVar1,2);
  auVar24 = vpinsrd_avx(auVar24,uVar1,3);
  auVar25 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar25 = vpinsrd_avx(auVar25,uVar1,2);
  auVar25 = vpinsrd_avx(auVar25,uVar1,3);
  uStack_2b0 = auVar25._0_8_;
  uStack_2a8 = auVar25._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xd4);
  auVar25 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar25 = vpinsrd_avx(auVar25,uVar1,2);
  auVar25 = vpinsrd_avx(auVar25,uVar1,3);
  auVar26 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar26 = vpinsrd_avx(auVar26,uVar1,2);
  auVar26 = vpinsrd_avx(auVar26,uVar1,3);
  uStack_270 = auVar26._0_8_;
  uStack_268 = auVar26._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xcc);
  auVar26 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar26 = vpinsrd_avx(auVar26,uVar1,2);
  auVar26 = vpinsrd_avx(auVar26,uVar1,3);
  auVar27 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar27 = vpinsrd_avx(auVar27,uVar1,2);
  auVar27 = vpinsrd_avx(auVar27,uVar1,3);
  uStack_230 = auVar27._0_8_;
  uStack_228 = auVar27._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x34);
  auVar27 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar27 = vpinsrd_avx(auVar27,uVar1,2);
  auVar27 = vpinsrd_avx(auVar27,uVar1,3);
  auVar28 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar28 = vpinsrd_avx(auVar28,uVar1,2);
  auVar28 = vpinsrd_avx(auVar28,uVar1,3);
  uStack_1f0 = auVar28._0_8_;
  uStack_1e8 = auVar28._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x4c);
  auVar28 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar28 = vpinsrd_avx(auVar28,uVar1,2);
  auVar28 = vpinsrd_avx(auVar28,uVar1,3);
  auVar29 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar29 = vpinsrd_avx(auVar29,uVar1,2);
  auVar29 = vpinsrd_avx(auVar29,uVar1,3);
  uStack_1b0 = auVar29._0_8_;
  uStack_1a8 = auVar29._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xb4);
  auVar29 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar29 = vpinsrd_avx(auVar29,uVar1,2);
  auVar29 = vpinsrd_avx(auVar29,uVar1,3);
  auVar30 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar30 = vpinsrd_avx(auVar30,uVar1,2);
  auVar30 = vpinsrd_avx(auVar30,uVar1,3);
  uStack_170 = auVar30._0_8_;
  uStack_168 = auVar30._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x8c);
  auVar30 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar30 = vpinsrd_avx(auVar30,uVar1,2);
  auVar30 = vpinsrd_avx(auVar30,uVar1,3);
  auVar31 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar31 = vpinsrd_avx(auVar31,uVar1,2);
  auVar31 = vpinsrd_avx(auVar31,uVar1,3);
  uStack_130 = auVar31._0_8_;
  uStack_128 = auVar31._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x74);
  auVar31 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar31 = vpinsrd_avx(auVar31,uVar1,2);
  auVar31 = vpinsrd_avx(auVar31,uVar1,3);
  auVar32 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar32 = vpinsrd_avx(auVar32,uVar1,2);
  auVar32 = vpinsrd_avx(auVar32,uVar1,3);
  uStack_f0 = auVar32._0_8_;
  uStack_e8 = auVar32._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xc);
  auVar32 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar32 = vpinsrd_avx(auVar32,uVar1,2);
  auVar32 = vpinsrd_avx(auVar32,uVar1,3);
  auVar101 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar101 = vpinsrd_avx(auVar101,uVar1,2);
  auVar101 = vpinsrd_avx(auVar101,uVar1,3);
  uStack_b0 = auVar101._0_8_;
  uStack_a8 = auVar101._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xf4);
  auVar101 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar101 = vpinsrd_avx(auVar101,uVar1,2);
  auVar101 = vpinsrd_avx(auVar101,uVar1,3);
  auVar100 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar100 = vpinsrd_avx(auVar100,uVar1,2);
  auVar100 = vpinsrd_avx(auVar100,uVar1,3);
  auVar100 = ZEXT116(0) * auVar101 + ZEXT116(1) * auVar100;
  auVar101 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar101;
  uStack_70 = auVar101._0_8_;
  uStack_68 = auVar101._8_8_;
  uVar35 = in_RDI[1];
  uVar36 = in_RDI[2];
  uVar37 = in_RDI[3];
  *in_RSI = *in_RDI;
  in_RSI[1] = uVar35;
  in_RSI[2] = uVar36;
  in_RSI[3] = uVar37;
  uVar35 = in_RDI[5];
  uVar36 = in_RDI[6];
  uVar37 = in_RDI[7];
  in_RSI[4] = in_RDI[4];
  in_RSI[5] = uVar35;
  in_RSI[6] = uVar36;
  in_RSI[7] = uVar37;
  uVar35 = in_RDI[9];
  uVar36 = in_RDI[10];
  uVar37 = in_RDI[0xb];
  in_RSI[8] = in_RDI[8];
  in_RSI[9] = uVar35;
  in_RSI[10] = uVar36;
  in_RSI[0xb] = uVar37;
  uVar35 = in_RDI[0xd];
  uVar36 = in_RDI[0xe];
  uVar37 = in_RDI[0xf];
  in_RSI[0xc] = in_RDI[0xc];
  in_RSI[0xd] = uVar35;
  in_RSI[0xe] = uVar36;
  in_RSI[0xf] = uVar37;
  uVar35 = in_RDI[0x11];
  uVar36 = in_RDI[0x12];
  uVar37 = in_RDI[0x13];
  in_RSI[0x10] = in_RDI[0x10];
  in_RSI[0x11] = uVar35;
  in_RSI[0x12] = uVar36;
  in_RSI[0x13] = uVar37;
  uVar35 = in_RDI[0x15];
  uVar36 = in_RDI[0x16];
  uVar37 = in_RDI[0x17];
  in_RSI[0x14] = in_RDI[0x14];
  in_RSI[0x15] = uVar35;
  in_RSI[0x16] = uVar36;
  in_RSI[0x17] = uVar37;
  uVar35 = in_RDI[0x19];
  uVar36 = in_RDI[0x1a];
  uVar37 = in_RDI[0x1b];
  in_RSI[0x18] = in_RDI[0x18];
  in_RSI[0x19] = uVar35;
  in_RSI[0x1a] = uVar36;
  in_RSI[0x1b] = uVar37;
  uVar35 = in_RDI[0x1d];
  uVar36 = in_RDI[0x1e];
  uVar37 = in_RDI[0x1f];
  in_RSI[0x1c] = in_RDI[0x1c];
  in_RSI[0x1d] = uVar35;
  in_RSI[0x1e] = uVar36;
  in_RSI[0x1f] = uVar37;
  uVar35 = in_RDI[0x21];
  uVar36 = in_RDI[0x22];
  uVar37 = in_RDI[0x23];
  in_RSI[0x20] = in_RDI[0x20];
  in_RSI[0x21] = uVar35;
  in_RSI[0x22] = uVar36;
  in_RSI[0x23] = uVar37;
  uVar35 = in_RDI[0x25];
  uVar36 = in_RDI[0x26];
  uVar37 = in_RDI[0x27];
  in_RSI[0x24] = in_RDI[0x24];
  in_RSI[0x25] = uVar35;
  in_RSI[0x26] = uVar36;
  in_RSI[0x27] = uVar37;
  uVar35 = in_RDI[0x29];
  uVar36 = in_RDI[0x2a];
  uVar37 = in_RDI[0x2b];
  in_RSI[0x28] = in_RDI[0x28];
  in_RSI[0x29] = uVar35;
  in_RSI[0x2a] = uVar36;
  in_RSI[0x2b] = uVar37;
  uVar35 = in_RDI[0x2d];
  uVar36 = in_RDI[0x2e];
  uVar37 = in_RDI[0x2f];
  in_RSI[0x2c] = in_RDI[0x2c];
  in_RSI[0x2d] = uVar35;
  in_RSI[0x2e] = uVar36;
  in_RSI[0x2f] = uVar37;
  uVar35 = in_RDI[0x31];
  uVar36 = in_RDI[0x32];
  uVar37 = in_RDI[0x33];
  in_RSI[0x30] = in_RDI[0x30];
  in_RSI[0x31] = uVar35;
  in_RSI[0x32] = uVar36;
  in_RSI[0x33] = uVar37;
  uVar35 = in_RDI[0x35];
  uVar36 = in_RDI[0x36];
  uVar37 = in_RDI[0x37];
  in_RSI[0x34] = in_RDI[0x34];
  in_RSI[0x35] = uVar35;
  in_RSI[0x36] = uVar36;
  in_RSI[0x37] = uVar37;
  uVar35 = in_RDI[0x39];
  uVar36 = in_RDI[0x3a];
  uVar37 = in_RDI[0x3b];
  in_RSI[0x38] = in_RDI[0x38];
  in_RSI[0x39] = uVar35;
  in_RSI[0x3a] = uVar36;
  in_RSI[0x3b] = uVar37;
  uVar35 = in_RDI[0x3d];
  uVar36 = in_RDI[0x3e];
  uVar37 = in_RDI[0x3f];
  in_RSI[0x3c] = in_RDI[0x3c];
  in_RSI[0x3d] = uVar35;
  in_RSI[0x3e] = uVar36;
  in_RSI[0x3f] = uVar37;
  uVar35 = in_RDI[0x41];
  uVar36 = in_RDI[0x42];
  uVar37 = in_RDI[0x43];
  in_RSI[0x40] = in_RDI[0x40];
  in_RSI[0x41] = uVar35;
  in_RSI[0x42] = uVar36;
  in_RSI[0x43] = uVar37;
  uVar35 = in_RDI[0x45];
  uVar36 = in_RDI[0x46];
  uVar37 = in_RDI[0x47];
  in_RSI[0x44] = in_RDI[0x44];
  in_RSI[0x45] = uVar35;
  in_RSI[0x46] = uVar36;
  in_RSI[0x47] = uVar37;
  uVar35 = in_RDI[0x49];
  uVar36 = in_RDI[0x4a];
  uVar37 = in_RDI[0x4b];
  in_RSI[0x48] = in_RDI[0x48];
  in_RSI[0x49] = uVar35;
  in_RSI[0x4a] = uVar36;
  in_RSI[0x4b] = uVar37;
  uVar35 = in_RDI[0x4d];
  uVar36 = in_RDI[0x4e];
  uVar37 = in_RDI[0x4f];
  in_RSI[0x4c] = in_RDI[0x4c];
  in_RSI[0x4d] = uVar35;
  in_RSI[0x4e] = uVar36;
  in_RSI[0x4f] = uVar37;
  uVar35 = in_RDI[0x51];
  uVar36 = in_RDI[0x52];
  uVar37 = in_RDI[0x53];
  in_RSI[0x50] = in_RDI[0x50];
  in_RSI[0x51] = uVar35;
  in_RSI[0x52] = uVar36;
  in_RSI[0x53] = uVar37;
  uVar35 = in_RDI[0x55];
  uVar36 = in_RDI[0x56];
  uVar37 = in_RDI[0x57];
  in_RSI[0x54] = in_RDI[0x54];
  in_RSI[0x55] = uVar35;
  in_RSI[0x56] = uVar36;
  in_RSI[0x57] = uVar37;
  uVar35 = in_RDI[0x59];
  uVar36 = in_RDI[0x5a];
  uVar37 = in_RDI[0x5b];
  in_RSI[0x58] = in_RDI[0x58];
  in_RSI[0x59] = uVar35;
  in_RSI[0x5a] = uVar36;
  in_RSI[0x5b] = uVar37;
  uVar35 = in_RDI[0x5d];
  uVar36 = in_RDI[0x5e];
  uVar37 = in_RDI[0x5f];
  in_RSI[0x5c] = in_RDI[0x5c];
  in_RSI[0x5d] = uVar35;
  in_RSI[0x5e] = uVar36;
  in_RSI[0x5f] = uVar37;
  uVar35 = in_RDI[0x61];
  uVar36 = in_RDI[0x62];
  uVar37 = in_RDI[99];
  in_RSI[0x60] = in_RDI[0x60];
  in_RSI[0x61] = uVar35;
  in_RSI[0x62] = uVar36;
  in_RSI[99] = uVar37;
  uVar35 = in_RDI[0x65];
  uVar36 = in_RDI[0x66];
  uVar37 = in_RDI[0x67];
  in_RSI[100] = in_RDI[100];
  in_RSI[0x65] = uVar35;
  in_RSI[0x66] = uVar36;
  in_RSI[0x67] = uVar37;
  uVar35 = in_RDI[0x69];
  uVar36 = in_RDI[0x6a];
  uVar37 = in_RDI[0x6b];
  in_RSI[0x68] = in_RDI[0x68];
  in_RSI[0x69] = uVar35;
  in_RSI[0x6a] = uVar36;
  in_RSI[0x6b] = uVar37;
  uVar35 = in_RDI[0x6d];
  uVar36 = in_RDI[0x6e];
  uVar37 = in_RDI[0x6f];
  in_RSI[0x6c] = in_RDI[0x6c];
  in_RSI[0x6d] = uVar35;
  in_RSI[0x6e] = uVar36;
  in_RSI[0x6f] = uVar37;
  uVar35 = in_RDI[0x71];
  uVar36 = in_RDI[0x72];
  uVar37 = in_RDI[0x73];
  in_RSI[0x70] = in_RDI[0x70];
  in_RSI[0x71] = uVar35;
  in_RSI[0x72] = uVar36;
  in_RSI[0x73] = uVar37;
  uVar35 = in_RDI[0x75];
  uVar36 = in_RDI[0x76];
  uVar37 = in_RDI[0x77];
  in_RSI[0x74] = in_RDI[0x74];
  in_RSI[0x75] = uVar35;
  in_RSI[0x76] = uVar36;
  in_RSI[0x77] = uVar37;
  uVar35 = in_RDI[0x79];
  uVar36 = in_RDI[0x7a];
  uVar37 = in_RDI[0x7b];
  in_RSI[0x78] = in_RDI[0x78];
  in_RSI[0x79] = uVar35;
  in_RSI[0x7a] = uVar36;
  in_RSI[0x7b] = uVar37;
  uVar35 = in_RDI[0x7d];
  uVar36 = in_RDI[0x7e];
  uVar37 = in_RDI[0x7f];
  in_RSI[0x7c] = in_RDI[0x7c];
  in_RSI[0x7d] = uVar35;
  in_RSI[0x7e] = uVar36;
  in_RSI[0x7f] = uVar37;
  auVar99._16_8_ = uStack_7f0;
  auVar99._0_16_ = auVar3;
  auVar99._24_8_ = uStack_7e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xfc),auVar99);
  auVar98._16_8_ = uStack_830;
  auVar98._0_16_ = auVar2;
  auVar98._24_8_ = uStack_828;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x80),auVar98);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x80) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x80),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x80) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x80),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x80) = auVar33;
  auVar97._16_8_ = uStack_830;
  auVar97._0_16_ = auVar2;
  auVar97._24_8_ = uStack_828;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xfc),auVar97);
  auVar96._16_8_ = uStack_7f0;
  auVar96._0_16_ = auVar3;
  auVar96._24_8_ = uStack_7e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x80),auVar96);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xfc) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xfc),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xfc) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xfc),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xfc) = auVar33;
  auVar95._16_8_ = uStack_770;
  auVar95._0_16_ = auVar5;
  auVar95._24_8_ = uStack_768;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf8),auVar95);
  auVar94._16_8_ = uStack_7b0;
  auVar94._0_16_ = auVar4;
  auVar94._24_8_ = uStack_7a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x84),auVar94);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x84),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x84),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar33;
  auVar93._16_8_ = uStack_7b0;
  auVar93._0_16_ = auVar4;
  auVar93._24_8_ = uStack_7a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf8),auVar93);
  auVar92._16_8_ = uStack_770;
  auVar92._0_16_ = auVar5;
  auVar92._24_8_ = uStack_768;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x84),auVar92);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xf8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xf8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar33;
  auVar91._16_8_ = uStack_6f0;
  auVar91._0_16_ = auVar7;
  auVar91._24_8_ = uStack_6e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf4),auVar91);
  auVar90._16_8_ = uStack_730;
  auVar90._0_16_ = auVar6;
  auVar90._24_8_ = uStack_728;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x88),auVar90);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x88),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x88),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar33;
  auVar89._16_8_ = uStack_730;
  auVar89._0_16_ = auVar6;
  auVar89._24_8_ = uStack_728;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf4),auVar89);
  auVar88._16_8_ = uStack_6f0;
  auVar88._0_16_ = auVar7;
  auVar88._24_8_ = uStack_6e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x88),auVar88);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xf4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xf4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar33;
  auVar87._16_8_ = uStack_670;
  auVar87._0_16_ = auVar9;
  auVar87._24_8_ = uStack_668;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf0),auVar87);
  auVar86._16_8_ = uStack_6b0;
  auVar86._0_16_ = auVar8;
  auVar86._24_8_ = uStack_6a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x8c),auVar86);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x8c) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x8c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x8c) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x8c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x8c) = auVar33;
  auVar85._16_8_ = uStack_6b0;
  auVar85._0_16_ = auVar8;
  auVar85._24_8_ = uStack_6a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf0),auVar85);
  auVar84._16_8_ = uStack_670;
  auVar84._0_16_ = auVar9;
  auVar84._24_8_ = uStack_668;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x8c),auVar84);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xf0) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xf0),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xf0) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xf0),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xf0) = auVar33;
  auVar83._16_8_ = uStack_5f0;
  auVar83._0_16_ = auVar11;
  auVar83._24_8_ = uStack_5e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xec),auVar83);
  auVar82._16_8_ = uStack_630;
  auVar82._0_16_ = auVar10;
  auVar82._24_8_ = uStack_628;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x90),auVar82);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x90) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x90),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x90) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x90),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x90) = auVar33;
  auVar81._16_8_ = uStack_630;
  auVar81._0_16_ = auVar10;
  auVar81._24_8_ = uStack_628;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xec),auVar81);
  auVar80._16_8_ = uStack_5f0;
  auVar80._0_16_ = auVar11;
  auVar80._24_8_ = uStack_5e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x90),auVar80);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xec) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xec),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xec) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xec),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xec) = auVar33;
  auVar79._16_8_ = uStack_570;
  auVar79._0_16_ = auVar13;
  auVar79._24_8_ = uStack_568;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe8),auVar79);
  auVar78._16_8_ = uStack_5b0;
  auVar78._0_16_ = auVar12;
  auVar78._24_8_ = uStack_5a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x94),auVar78);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x94),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x94),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar33;
  auVar77._16_8_ = uStack_5b0;
  auVar77._0_16_ = auVar12;
  auVar77._24_8_ = uStack_5a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe8),auVar77);
  auVar76._16_8_ = uStack_570;
  auVar76._0_16_ = auVar13;
  auVar76._24_8_ = uStack_568;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x94),auVar76);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xe8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xe8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar33;
  auVar75._16_8_ = uStack_4f0;
  auVar75._0_16_ = auVar15;
  auVar75._24_8_ = uStack_4e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe4),auVar75);
  auVar74._16_8_ = uStack_530;
  auVar74._0_16_ = auVar14;
  auVar74._24_8_ = uStack_528;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x98),auVar74);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x98),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x98),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar33;
  auVar73._16_8_ = uStack_530;
  auVar73._0_16_ = auVar14;
  auVar73._24_8_ = uStack_528;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe4),auVar73);
  auVar72._16_8_ = uStack_4f0;
  auVar72._0_16_ = auVar15;
  auVar72._24_8_ = uStack_4e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x98),auVar72);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xe4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xe4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar33;
  auVar71._16_8_ = uStack_470;
  auVar71._0_16_ = auVar17;
  auVar71._24_8_ = uStack_468;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe0),auVar71);
  auVar70._16_8_ = uStack_4b0;
  auVar70._0_16_ = auVar16;
  auVar70._24_8_ = uStack_4a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x9c),auVar70);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0x9c) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x9c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x9c) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x9c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x9c) = auVar33;
  auVar69._16_8_ = uStack_4b0;
  auVar69._0_16_ = auVar16;
  auVar69._24_8_ = uStack_4a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe0),auVar69);
  auVar68._16_8_ = uStack_470;
  auVar68._0_16_ = auVar17;
  auVar68._24_8_ = uStack_468;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x9c),auVar68);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xe0) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xe0),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xe0) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xe0),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xe0) = auVar33;
  auVar67._16_8_ = uStack_3f0;
  auVar67._0_16_ = auVar19;
  auVar67._24_8_ = uStack_3e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xdc),auVar67);
  auVar66._16_8_ = uStack_430;
  auVar66._0_16_ = auVar18;
  auVar66._24_8_ = uStack_428;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa0),auVar66);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xa0) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xa0),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xa0) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xa0),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xa0) = auVar33;
  auVar65._16_8_ = uStack_430;
  auVar65._0_16_ = auVar18;
  auVar65._24_8_ = uStack_428;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xdc),auVar65);
  auVar64._16_8_ = uStack_3f0;
  auVar64._0_16_ = auVar19;
  auVar64._24_8_ = uStack_3e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa0),auVar64);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xdc) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xdc),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xdc) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xdc),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xdc) = auVar33;
  auVar63._16_8_ = uStack_370;
  auVar63._0_16_ = auVar21;
  auVar63._24_8_ = uStack_368;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd8),auVar63);
  auVar62._16_8_ = uStack_3b0;
  auVar62._0_16_ = auVar20;
  auVar62._24_8_ = uStack_3a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa4),auVar62);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xa4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xa4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar33;
  auVar61._16_8_ = uStack_3b0;
  auVar61._0_16_ = auVar20;
  auVar61._24_8_ = uStack_3a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd8),auVar61);
  auVar60._16_8_ = uStack_370;
  auVar60._0_16_ = auVar21;
  auVar60._24_8_ = uStack_368;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa4),auVar60);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xd8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xd8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar33;
  auVar59._16_8_ = uStack_2f0;
  auVar59._0_16_ = auVar23;
  auVar59._24_8_ = uStack_2e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd4),auVar59);
  auVar58._16_8_ = uStack_330;
  auVar58._0_16_ = auVar22;
  auVar58._24_8_ = uStack_328;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa8),auVar58);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xa8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xa8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar33;
  auVar57._16_8_ = uStack_330;
  auVar57._0_16_ = auVar22;
  auVar57._24_8_ = uStack_328;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd4),auVar57);
  auVar56._16_8_ = uStack_2f0;
  auVar56._0_16_ = auVar23;
  auVar56._24_8_ = uStack_2e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa8),auVar56);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xd4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xd4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar33;
  auVar55._16_8_ = uStack_270;
  auVar55._0_16_ = auVar25;
  auVar55._24_8_ = uStack_268;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd0),auVar55);
  auVar54._16_8_ = uStack_2b0;
  auVar54._0_16_ = auVar24;
  auVar54._24_8_ = uStack_2a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xac),auVar54);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xac) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xac),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xac) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xac),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xac) = auVar33;
  auVar53._16_8_ = uStack_2b0;
  auVar53._0_16_ = auVar24;
  auVar53._24_8_ = uStack_2a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd0),auVar53);
  auVar52._16_8_ = uStack_270;
  auVar52._0_16_ = auVar25;
  auVar52._24_8_ = uStack_268;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xac),auVar52);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xd0) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xd0),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xd0) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xd0),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xd0) = auVar33;
  auVar51._16_8_ = uStack_1f0;
  auVar51._0_16_ = auVar27;
  auVar51._24_8_ = uStack_1e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xcc),auVar51);
  auVar50._16_8_ = uStack_230;
  auVar50._0_16_ = auVar26;
  auVar50._24_8_ = uStack_228;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb0),auVar50);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xb0) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xb0),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xb0) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xb0),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xb0) = auVar33;
  auVar49._16_8_ = uStack_230;
  auVar49._0_16_ = auVar26;
  auVar49._24_8_ = uStack_228;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xcc),auVar49);
  auVar48._16_8_ = uStack_1f0;
  auVar48._0_16_ = auVar27;
  auVar48._24_8_ = uStack_1e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb0),auVar48);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xcc) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xcc),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xcc) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xcc),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xcc) = auVar33;
  auVar47._16_8_ = uStack_170;
  auVar47._0_16_ = auVar29;
  auVar47._24_8_ = uStack_168;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 200),auVar47);
  auVar46._16_8_ = uStack_1b0;
  auVar46._0_16_ = auVar28;
  auVar46._24_8_ = uStack_1a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb4),auVar46);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xb4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xb4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar33;
  auVar45._16_8_ = uStack_1b0;
  auVar45._0_16_ = auVar28;
  auVar45._24_8_ = uStack_1a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 200),auVar45);
  auVar44._16_8_ = uStack_170;
  auVar44._0_16_ = auVar29;
  auVar44._24_8_ = uStack_168;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb4),auVar44);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 200) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 200),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 200) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 200),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 200) = auVar33;
  auVar43._16_8_ = uStack_f0;
  auVar43._0_16_ = auVar31;
  auVar43._24_8_ = uStack_e8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xc4),auVar43);
  auVar42._16_8_ = uStack_130;
  auVar42._0_16_ = auVar30;
  auVar42._24_8_ = uStack_128;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb8),auVar42);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xb8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xb8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar33;
  auVar41._16_8_ = uStack_130;
  auVar41._0_16_ = auVar30;
  auVar41._24_8_ = uStack_128;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xc4),auVar41);
  auVar40._16_8_ = uStack_f0;
  auVar40._0_16_ = auVar31;
  auVar40._24_8_ = uStack_e8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb8),auVar40);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xc4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xc4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar33;
  auVar39._16_8_ = uStack_70;
  auVar39._0_16_ = auVar100;
  auVar39._24_8_ = uStack_68;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xc0),auVar39);
  auVar38._16_8_ = uStack_b0;
  auVar38._0_16_ = auVar32;
  auVar38._24_8_ = uStack_a8;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xbc),auVar38);
  auVar33 = vpaddd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xbc) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xbc),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xbc) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xbc),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xbc) = auVar33;
  auVar33._16_8_ = uStack_b0;
  auVar33._0_16_ = auVar32;
  auVar33._24_8_ = uStack_a8;
  auVar33 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xc0),auVar33);
  auVar34._16_8_ = uStack_70;
  auVar34._0_16_ = auVar100;
  auVar34._24_8_ = uStack_68;
  auVar34 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xbc),auVar34);
  auVar33 = vpsubd_avx2(auVar33,auVar34);
  *(undefined1 (*) [32])(in_RSI + 0xc0) = auVar33;
  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xc0),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xc0) = auVar33;
  auVar33 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xc0),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xc0) = auVar33;
  return;
}

Assistant:

static inline void fdct64_stage10_avx2(__m256i *x9, __m256i *x10,
                                       const int32_t *cospi,
                                       const __m256i *__rounding,
                                       int8_t cos_bit) {
  __m256i cospi_p63 = _mm256_set1_epi32(cospi[63]);
  __m256i cospi_p01 = _mm256_set1_epi32(cospi[1]);
  __m256i cospi_p31 = _mm256_set1_epi32(cospi[31]);
  __m256i cospi_p33 = _mm256_set1_epi32(cospi[33]);
  __m256i cospi_p47 = _mm256_set1_epi32(cospi[47]);
  __m256i cospi_p17 = _mm256_set1_epi32(cospi[17]);
  __m256i cospi_p15 = _mm256_set1_epi32(cospi[15]);
  __m256i cospi_p49 = _mm256_set1_epi32(cospi[49]);
  __m256i cospi_p55 = _mm256_set1_epi32(cospi[55]);
  __m256i cospi_p09 = _mm256_set1_epi32(cospi[9]);
  __m256i cospi_p23 = _mm256_set1_epi32(cospi[23]);
  __m256i cospi_p41 = _mm256_set1_epi32(cospi[41]);
  __m256i cospi_p39 = _mm256_set1_epi32(cospi[39]);
  __m256i cospi_p25 = _mm256_set1_epi32(cospi[25]);
  __m256i cospi_p07 = _mm256_set1_epi32(cospi[7]);
  __m256i cospi_p57 = _mm256_set1_epi32(cospi[57]);
  __m256i cospi_p59 = _mm256_set1_epi32(cospi[59]);
  __m256i cospi_p05 = _mm256_set1_epi32(cospi[5]);
  __m256i cospi_p27 = _mm256_set1_epi32(cospi[27]);
  __m256i cospi_p37 = _mm256_set1_epi32(cospi[37]);
  __m256i cospi_p43 = _mm256_set1_epi32(cospi[43]);
  __m256i cospi_p21 = _mm256_set1_epi32(cospi[21]);
  __m256i cospi_p11 = _mm256_set1_epi32(cospi[11]);
  __m256i cospi_p53 = _mm256_set1_epi32(cospi[53]);
  __m256i cospi_p51 = _mm256_set1_epi32(cospi[51]);
  __m256i cospi_p13 = _mm256_set1_epi32(cospi[13]);
  __m256i cospi_p19 = _mm256_set1_epi32(cospi[19]);
  __m256i cospi_p45 = _mm256_set1_epi32(cospi[45]);
  __m256i cospi_p35 = _mm256_set1_epi32(cospi[35]);
  __m256i cospi_p29 = _mm256_set1_epi32(cospi[29]);
  __m256i cospi_p03 = _mm256_set1_epi32(cospi[3]);
  __m256i cospi_p61 = _mm256_set1_epi32(cospi[61]);

  x10[0] = x9[0];
  x10[1] = x9[1];
  x10[2] = x9[2];
  x10[3] = x9[3];
  x10[4] = x9[4];
  x10[5] = x9[5];
  x10[6] = x9[6];
  x10[7] = x9[7];
  x10[8] = x9[8];
  x10[9] = x9[9];
  x10[10] = x9[10];
  x10[11] = x9[11];
  x10[12] = x9[12];
  x10[13] = x9[13];
  x10[14] = x9[14];
  x10[15] = x9[15];
  x10[16] = x9[16];
  x10[17] = x9[17];
  x10[18] = x9[18];
  x10[19] = x9[19];
  x10[20] = x9[20];
  x10[21] = x9[21];
  x10[22] = x9[22];
  x10[23] = x9[23];
  x10[24] = x9[24];
  x10[25] = x9[25];
  x10[26] = x9[26];
  x10[27] = x9[27];
  x10[28] = x9[28];
  x10[29] = x9[29];
  x10[30] = x9[30];
  x10[31] = x9[31];
  btf_32_type0_avx2_new(cospi_p01, cospi_p63, x9[63], x9[32], x10[32], x10[63],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p33, cospi_p31, x9[62], x9[33], x10[33], x10[62],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p17, cospi_p47, x9[61], x9[34], x10[34], x10[61],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p49, cospi_p15, x9[60], x9[35], x10[35], x10[60],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p09, cospi_p55, x9[59], x9[36], x10[36], x10[59],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p41, cospi_p23, x9[58], x9[37], x10[37], x10[58],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p25, cospi_p39, x9[57], x9[38], x10[38], x10[57],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p57, cospi_p07, x9[56], x9[39], x10[39], x10[56],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p05, cospi_p59, x9[55], x9[40], x10[40], x10[55],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p37, cospi_p27, x9[54], x9[41], x10[41], x10[54],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p21, cospi_p43, x9[53], x9[42], x10[42], x10[53],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p53, cospi_p11, x9[52], x9[43], x10[43], x10[52],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p13, cospi_p51, x9[51], x9[44], x10[44], x10[51],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p45, cospi_p19, x9[50], x9[45], x10[45], x10[50],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p29, cospi_p35, x9[49], x9[46], x10[46], x10[49],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p61, cospi_p03, x9[48], x9[47], x10[47], x10[48],
                        *__rounding, cos_bit);
}